

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

void __thiscall GrcSymbolTable::InitGlyphAttrs(GrcSymbolTable *this)

{
  Symbol this_00;
  Symbol sta2;
  string staLevel;
  int iLevel;
  Symbol psym;
  undefined8 in_stack_ffffffffffffee50;
  SymbolType symt;
  allocator *paVar1;
  GrcStructName *in_stack_ffffffffffffee58;
  GrcSymbolTable *in_stack_ffffffffffffee60;
  string *in_stack_ffffffffffffee68;
  allocator *paVar2;
  string *in_stack_ffffffffffffee70;
  allocator *sta2_00;
  string *in_stack_ffffffffffffee78;
  allocator *sta3;
  string *in_stack_ffffffffffffee80;
  string *in_stack_ffffffffffffee88;
  allocator *sta1;
  GrcStructName *in_stack_ffffffffffffee90;
  undefined8 in_stack_ffffffffffffee98;
  undefined8 in_stack_ffffffffffffeea8;
  OpPrec OVar3;
  undefined8 in_stack_ffffffffffffeeb0;
  allocator *paVar4;
  GrcStructName *in_stack_ffffffffffffeeb8;
  allocator *xns;
  GrcSymbolTable *in_stack_ffffffffffffeec0;
  allocator local_e81;
  string local_e80 [39];
  allocator local_e59;
  string local_e58 [63];
  allocator local_e19;
  string local_e18 [39];
  allocator local_df1;
  string local_df0 [39];
  allocator local_dc9;
  string local_dc8 [63];
  allocator local_d89;
  string local_d88 [39];
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [63];
  allocator local_cf9;
  string local_cf8 [39];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [63];
  allocator local_c69;
  string local_c68 [39];
  allocator local_c41;
  string local_c40 [39];
  allocator local_c19;
  string local_c18 [63];
  allocator local_bd9;
  string local_bd8 [39];
  allocator local_bb1;
  string local_bb0 [39];
  allocator local_b89;
  string local_b88 [63];
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [39];
  allocator local_af9;
  string local_af8 [63];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [63];
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [63];
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [63];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [63];
  allocator local_919;
  string local_918 [39];
  allocator local_8f1;
  string local_8f0 [63];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [63];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [63];
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [63];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [63];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [63];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [63];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [63];
  allocator local_539;
  string local_538 [63];
  allocator local_4f9;
  string local_4f8 [63];
  allocator local_4b9;
  string local_4b8 [32];
  string local_498 [39];
  allocator local_471;
  string local_470 [63];
  allocator local_431;
  string local_430 [32];
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [63];
  allocator local_3a9;
  string local_3a8 [32];
  string local_388 [39];
  allocator local_361;
  string local_360 [63];
  allocator local_321;
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [56];
  string local_2a0 [32];
  int local_280;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [63];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [63];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [63];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [63];
  allocator local_d9;
  string local_d8 [63];
  allocator local_99;
  string local_98 [79];
  allocator local_49;
  string local_48 [56];
  Symbol local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"component",&local_49);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68)
  ;
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8b3a);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"directionality",&local_99);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68)
  ;
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8bee);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"breakweight",&local_d9);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68)
  ;
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8ca2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"justify",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"stretch",&local_141);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8d91);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"justify",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"shrink",&local_1a9);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8e9a);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"justify",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"step",&local_211);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d8fa3);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"justify",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"weight",&local_279);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                      (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
  GrcStructName::~GrcStructName((GrcStructName *)0x1d90ac);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  local_10->m_fGeneric = true;
  for (local_280 = 0; symt = (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20),
      OVar3 = (OpPrec)((ulong)in_stack_ffffffffffffeea8 >> 0x20), local_280 < 4;
      local_280 = local_280 + 1) {
    std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffee98 >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"justify",&local_2d9);
    std::__cxx11::string::string(local_300,local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"stretch",&local_321);
    GrcStructName::GrcStructName
              (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
               in_stack_ffffffffffffee78);
    local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                        (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
    GrcStructName::~GrcStructName((GrcStructName *)0x1d9201);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    local_10->m_fGeneric = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"justify",&local_361);
    std::__cxx11::string::string(local_388,local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"shrink",&local_3a9);
    GrcStructName::GrcStructName
              (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
               in_stack_ffffffffffffee78);
    local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                        (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
    GrcStructName::~GrcStructName((GrcStructName *)0x1d9336);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    local_10->m_fGeneric = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"justify",&local_3e9);
    std::__cxx11::string::string(local_410,local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"step",&local_431);
    GrcStructName::GrcStructName
              (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
               in_stack_ffffffffffffee78);
    local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                        (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
    GrcStructName::~GrcStructName((GrcStructName *)0x1d946b);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    local_10->m_fGeneric = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"justify",&local_471);
    std::__cxx11::string::string(local_498,local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,"weight",&local_4b9);
    GrcStructName::GrcStructName
              (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
               in_stack_ffffffffffffee78);
    local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                        (SymbolType)((ulong)in_stack_ffffffffffffee50 >> 0x20));
    GrcStructName::~GrcStructName((GrcStructName *)0x1d95a0);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    local_10->m_fGeneric = true;
    std::__cxx11::string::~string(local_2a0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"*actualForPseudo*",&local_4f9);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68)
  ;
  local_10 = PreDefineSymbol(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                             (SymbolType)((ulong)in_stack_ffffffffffffeeb0 >> 0x20),
                             (ExpressionType)in_stack_ffffffffffffeeb0,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1d9d72);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"*skipPasses*",&local_539);
  GrcStructName::GrcStructName((GrcStructName *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68)
  ;
  local_10 = PreDefineSymbol(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                             (SymbolType)((ulong)in_stack_ffffffffffffeeb0 >> 0x20),
                             (ExpressionType)in_stack_ffffffffffffeeb0,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1d9e31);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"mirror",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"glyph",&local_5a1);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = PreDefineSymbol(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                             (SymbolType)((ulong)in_stack_ffffffffffffeeb0 >> 0x20),
                             (ExpressionType)in_stack_ffffffffffffeeb0,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1d9f2b);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"mirror",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"isEncoded",&local_609);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = PreDefineSymbol(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                             (SymbolType)((ulong)in_stack_ffffffffffffeeb0 >> 0x20),
                             (ExpressionType)in_stack_ffffffffffffeeb0,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da03f);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"collision",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"flags",&local_671);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da148);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"collision",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"min",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"x",&local_701);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da28c);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"collision",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"max",&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"x",&local_791);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da3ea);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d0,"collision",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"min",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"y",&local_821);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da548);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"collision",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"max",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"y",&local_8b1);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da6a6);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f0,"collision",&local_8f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_918,"margin",&local_919);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da7c9);
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"collision",&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"marginweight",&local_981);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da8d2);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"sequence",&local_9c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"class",&local_9e9);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1da9db);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"sequence",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"proxClass",&local_a51);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1daae4);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a90,"sequence",&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"order",&local_ab9);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1dabed);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af8,"sequence",&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b20,"above",&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"xoffset",&local_b49);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1dad31);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"sequence",&local_b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb0,"above",&local_bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"weight",&local_bd9);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1dae8f);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  local_10->m_fGeneric = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"sequence",&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"below",&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"xlimit",&local_c69);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  this_00 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  local_10 = this_00;
  GrcStructName::~GrcStructName((GrcStructName *)0x1dafe7);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  local_10->m_fGeneric = true;
  xns = &local_ca9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"sequence",xns);
  paVar4 = &local_cd1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd0,"below",paVar4);
  paVar1 = &local_cf9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf8,"weight",paVar1);
  OVar3 = (OpPrec)((ulong)paVar1 >> 0x20);
  GrcStructName::GrcStructName
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1db12d);
  std::__cxx11::string::~string(local_cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  local_10->m_fGeneric = true;
  paVar1 = &local_d39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d38,"sequence",paVar1);
  paVar1 = &local_d61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d60,"valign",paVar1);
  sta1 = &local_d89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d88,"height",sta1);
  GrcStructName::GrcStructName
            ((GrcStructName *)paVar1,(string *)sta1,in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78);
  sta2 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  local_10 = sta2;
  GrcStructName::~GrcStructName((GrcStructName *)0x1db273);
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  local_10->m_fGeneric = true;
  sta3 = &local_dc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"sequence",sta3);
  sta2_00 = &local_df1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df0,"valign",sta2_00);
  paVar2 = &local_e19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e18,"weight",paVar2);
  GrcStructName::GrcStructName
            ((GrcStructName *)paVar1,(string *)sta1,&sta2->m_staFieldName,(string *)sta3);
  local_10 = AddType2(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,symt);
  GrcStructName::~GrcStructName((GrcStructName *)0x1db3b9);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_e19);
  std::__cxx11::string::~string(local_df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df1);
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
  local_10->m_fGeneric = true;
  paVar1 = &local_e59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e58,"collision",paVar1);
  paVar1 = &local_e81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e80,"complexFit",paVar1);
  GrcStructName::GrcStructName((GrcStructName *)sta2,(string *)sta3,(string *)sta2_00);
  local_10 = PreDefineSymbol((GrcSymbolTable *)this_00,(GrcStructName *)xns,
                             (SymbolType)((ulong)paVar4 >> 0x20),(ExpressionType)paVar4,OVar3);
  GrcStructName::~GrcStructName((GrcStructName *)0x1db4d3);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator((allocator<char> *)&local_e81);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator((allocator<char> *)&local_e59);
  local_10->m_fGeneric = true;
  return;
}

Assistant:

void GrcSymbolTable::InitGlyphAttrs()
{
	//	These were first recorded as slot attributes:

	Symbol psym;
	psym = AddType2(GrcStructName("component"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("directionality"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("breakweight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;

	psym = AddType2(GrcStructName("justify", "stretch"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "shrink"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "step"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("justify", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;

	for (int iLevel = 0; iLevel <= kMaxJustLevel; iLevel++)
	{
		auto staLevel = std::to_string(iLevel);
		psym = AddType2(GrcStructName("justify", staLevel, "stretch"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "shrink"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "step"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
		psym = AddType2(GrcStructName("justify", staLevel, "weight"), ksymtGlyphAttr);
		psym->m_fGeneric = true;
	}

	//	A fake glyph attribute that is used to store the actual glyph ID for pseudo-glyphs.
	psym = PreDefineSymbol(GrcStructName("*actualForPseudo*"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;

	//	A built-in glyph attribute that is hold the pass optimization flags (bitmap indicating
	//	the passes for which a glyph is not a key glyph).
	psym = PreDefineSymbol(GrcStructName("*skipPasses*"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;

	// These are just glyph attributes. These two must be in this order and contiguous,
	// so that the internal IDs are assigned correctly.

	psym = PreDefineSymbol(GrcStructName("mirror", "glyph"), ksymtGlyphAttr, kexptGlyphID);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("mirror", "isEncoded"), ksymtGlyphAttr, kexptBoolean);
	psym->m_fGeneric = true;

	// Built-in glyph attributes that define how automatic collision fixing should work.
	psym = AddType2(GrcStructName("collision", "flags"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "min", "x"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "max", "x"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "min", "y"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "max", "y"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "margin"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("collision", "marginweight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	// Not defined as glyph attributes:
	//psym = AddType2(GrcStructName("collision", "exclude", "glyph"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;
	//psym = AddType2(GrcStructName("collision", "exclude", "offset", "x"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;
	//psym = AddType2(GrcStructName("collision", "exclude", "offset", "y"), ksymtGlyphAttr);
	//psym->m_fGeneric = true;

	psym = AddType2(GrcStructName("sequence", "class"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "proxClass"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "order"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "above", "xoffset"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "above", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "below", "xlimit"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "below", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "valign", "height"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	psym = AddType2(GrcStructName("sequence", "valign", "weight"), ksymtGlyphAttr);
	psym->m_fGeneric = true;
	
	// This one is used by the compiler, but not stored in the font:
	psym = PreDefineSymbol(GrcStructName("collision", "complexFit"), ksymtGlyphAttr, kexptNumber);
	psym->m_fGeneric = true;
}